

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::CumulativeReporterBase
          (CumulativeReporterBase<Catch::JunitReporter> *this,ReporterConfig *_config)

{
  size_type sVar1;
  ReusableStringStream local_78;
  _Rb_tree<Catch::Verbosity,_Catch::Verbosity,_std::_Identity<Catch::Verbosity>,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
  local_60;
  
  (this->super_IStreamingReporter)._vptr_IStreamingReporter =
       (_func_int **)&PTR__CumulativeReporterBase_001a0e08;
  clara::std::__shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>,
             &(_config->m_fullConfig).
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>);
  this->stream = _config->m_stream;
  memset(&this->m_assertions,0,0xb2);
  getSupportedVerbosities();
  local_78.super_NonCopyable._vptr_NonCopyable._0_4_ =
       (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->super_NonCopyable)._vptr_NonCopyable[0x14])();
  sVar1 = clara::std::
          set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>::
          count((set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
                 *)&local_60,(key_type *)&local_78);
  clara::std::
  _Rb_tree<Catch::Verbosity,_Catch::Verbosity,_std::_Identity<Catch::Verbosity>,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
  ::~_Rb_tree(&local_60);
  if (sVar1 != 0) {
    return;
  }
  ReusableStringStream::ReusableStringStream(&local_78);
  std::operator<<(local_78.m_oss,"Verbosity level not supported by this reporter");
  std::__cxx11::stringbuf::str();
  throw_domain_error((string *)&local_60);
}

Assistant:

CumulativeReporterBase( ReporterConfig const& _config )
        :   m_config( _config.fullConfig() ),
            stream( _config.stream() )
        {
            m_reporterPrefs.shouldRedirectStdOut = false;
            if( !DerivedT::getSupportedVerbosities().count( m_config->verbosity() ) )
                CATCH_ERROR( "Verbosity level not supported by this reporter" );
        }